

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLDateTime::fillString(XMLDateTime *this,XMLCh **ptr,int value,XMLSize_t expLen)

{
  short *psVar1;
  long lVar2;
  XMLCh *pXVar3;
  long lVar4;
  XMLCh strBuffer [16];
  XMLCh local_38 [20];
  
  if (expLen < 0x10) {
    XMLString::binToText(value,local_38,expLen,10,this->fMemoryManager);
    lVar2 = 0;
    do {
      psVar1 = (short *)((long)local_38 + lVar2);
      lVar2 = lVar2 + 2;
    } while (*psVar1 != 0);
    lVar2 = (lVar2 >> 1) + -1;
    lVar4 = expLen - lVar2;
    if (lVar4 != 0) {
      pXVar3 = *ptr;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      do {
        *pXVar3 = L'0';
        pXVar3 = pXVar3 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      *ptr = pXVar3;
    }
    if (lVar2 != 0) {
      pXVar3 = *ptr;
      lVar4 = 0;
      do {
        *pXVar3 = local_38[lVar4];
        pXVar3 = pXVar3 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
      *ptr = pXVar3;
    }
    return;
  }
  __assert_fail("expLen < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                ,0x749,"void xercesc_4_0::XMLDateTime::fillString(XMLCh *&, int, XMLSize_t) const");
}

Assistant:

void XMLDateTime::fillString(XMLCh*& ptr, int value, XMLSize_t expLen) const
{
    XMLCh strBuffer[16];
    assert(expLen < 16);
    XMLString::binToText(value, strBuffer, expLen, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    XMLSize_t i;
    //append leading zeros
    for (i = 0; i < expLen - actualLen; i++)
    {
        *ptr++ = chDigit_0;
    }

    for (i = 0; i < actualLen; i++)
    {
        *ptr++ = strBuffer[i];
    }

}